

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O3

void cmServer::reportMessage(char *msg,char *title,bool *param_3,void *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  string titleString;
  string local_60;
  string local_40;
  
  if (data == (void *)0x0) {
    __assert_fail("request",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServer.cxx"
                  ,0xa4,
                  "static void cmServer::reportMessage(const char *, const char *, bool &, void *)")
    ;
  }
  if (msg != (char *)0x0) {
    paVar1 = &local_40.field_2;
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    local_40._M_dataplus._M_p = (pointer)paVar1;
    if (title != (char *)0x0) {
      strlen(title);
      std::__cxx11::string::_M_replace((ulong)&local_40,0,(char *)0x0,(ulong)title);
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    sVar2 = strlen(msg);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,msg,msg + sVar2);
    cmServerRequest::ReportMessage((cmServerRequest *)data,&local_60,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,
                      CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                               local_40.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  __assert_fail("msg",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServer.cxx"
                ,0xa5,
                "static void cmServer::reportMessage(const char *, const char *, bool &, void *)");
}

Assistant:

void cmServer::reportMessage(const char* msg, const char* title,
                             bool& /* cancel */, void* data)
{
  const cmServerRequest* request = static_cast<const cmServerRequest*>(data);
  assert(request);
  assert(msg);
  std::string titleString;
  if (title) {
    titleString = title;
  }
  request->ReportMessage(std::string(msg), titleString);
}